

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzBuffToBuffCompress
              (char *dest,uint *destLen,char *source,uint sourceLen,int blockSize100k,int verbosity,
              int workFactor)

{
  undefined1 auStack_88 [4];
  int ret;
  bz_stream strm;
  int verbosity_local;
  int blockSize100k_local;
  uint sourceLen_local;
  char *source_local;
  uint *destLen_local;
  char *dest_local;
  
  if ((((((dest == (char *)0x0) || (destLen == (uint *)0x0)) || (source == (char *)0x0)) ||
       ((blockSize100k < 1 || (9 < blockSize100k)))) ||
      ((verbosity < 0 || ((4 < verbosity || (workFactor < 0)))))) || (0xfa < workFactor)) {
    dest_local._4_4_ = -2;
  }
  else {
    if (workFactor == 0) {
      workFactor = 0x1e;
    }
    strm.state = (void *)0x0;
    strm.bzalloc = (_func_void_ptr_void_ptr_int_int *)0x0;
    strm.bzfree = (_func_void_void_ptr_void_ptr *)0x0;
    strm.opaque._4_4_ = verbosity;
    dest_local._4_4_ =
         BZ2_bzCompressInit((bz_stream *)auStack_88,blockSize100k,verbosity,workFactor);
    if (dest_local._4_4_ == 0) {
      strm.next_out._0_4_ = *destLen;
      _auStack_88 = source;
      strm.next_in._0_4_ = sourceLen;
      strm._16_8_ = dest;
      dest_local._4_4_ = BZ2_bzCompress((bz_stream *)auStack_88,2);
      if (dest_local._4_4_ == 3) {
        BZ2_bzCompressEnd((bz_stream *)auStack_88);
        dest_local._4_4_ = -8;
      }
      else if (dest_local._4_4_ == 4) {
        *destLen = *destLen - (uint)strm.next_out;
        BZ2_bzCompressEnd((bz_stream *)auStack_88);
        dest_local._4_4_ = 0;
      }
      else {
        BZ2_bzCompressEnd((bz_stream *)auStack_88);
      }
    }
  }
  return dest_local._4_4_;
}

Assistant:

int BZ2_bzBuffToBuffCompress 
                         ( char*         dest, 
                           unsigned int* destLen,
                           char*         source, 
                           unsigned int  sourceLen,
                           int           blockSize100k, 
                           int           verbosity, 
                           int           workFactor )
{
   bz_stream strm;
   int ret;

   if (dest == NULL || destLen == NULL || 
       source == NULL ||
       blockSize100k < 1 || blockSize100k > 9 ||
       verbosity < 0 || verbosity > 4 ||
       workFactor < 0 || workFactor > 250) 
      return BZ_PARAM_ERROR;

   if (workFactor == 0) workFactor = 30;
   strm.bzalloc = NULL;
   strm.bzfree = NULL;
   strm.opaque = NULL;
   ret = BZ2_bzCompressInit ( &strm, blockSize100k, 
                              verbosity, workFactor );
   if (ret != BZ_OK) return ret;

   strm.next_in = source;
   strm.next_out = dest;
   strm.avail_in = sourceLen;
   strm.avail_out = *destLen;

   ret = BZ2_bzCompress ( &strm, BZ_FINISH );
   if (ret == BZ_FINISH_OK) goto output_overflow;
   if (ret != BZ_STREAM_END) goto errhandler;

   /* normal termination */
   *destLen -= strm.avail_out;   
   BZ2_bzCompressEnd ( &strm );
   return BZ_OK;

   output_overflow:
   BZ2_bzCompressEnd ( &strm );
   return BZ_OUTBUFF_FULL;

   errhandler:
   BZ2_bzCompressEnd ( &strm );
   return ret;
}